

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replacement_scan-c.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::duckdb_capi_replacement_callback
          (duckdb *this,ClientContext *context,ReplacementScanInput *input,
          optional_ptr<duckdb::ReplacementScanData,_true> data)

{
  string *psVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> _Var3;
  undefined8 uVar4;
  Value *pVVar5;
  TableFunctionRef *this_00;
  ConstantExpression *this_01;
  pointer pTVar6;
  BinderException *this_02;
  Value *other;
  templated_unique_single_t table_function;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  CAPIReplacementScanInfo info;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> local_130;
  __uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> local_128;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_120;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_118;
  Value local_f8;
  ReplacementScanData *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Value *local_90;
  Value *pVStack_88;
  undefined8 local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  optional_ptr<duckdb::ReplacementScanData,_true> local_38;
  
  psVar1 = input->table_name;
  local_128._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
       (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)this;
  local_38.ptr = data.ptr;
  optional_ptr<duckdb::ReplacementScanData,_true>::CheckValid(&local_38);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b8 = local_38.ptr;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_90 = (Value *)0x0;
  pVStack_88 = (Value *)0x0;
  local_80 = 0;
  local_78 = local_68;
  local_70 = 0;
  local_68[0] = 0;
  (*(code *)local_38.ptr[1]._vptr_ReplacementScanData)
            (&local_b8,(psVar1->_M_dataplus)._M_p,local_38.ptr[2]._vptr_ReplacementScanData);
  if (local_70 == 0) {
    if (local_b0._M_string_length == 0) {
      *(_func_int ***)
       local_128._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (_func_int **)0x0;
    }
    else {
      this_00 = (TableFunctionRef *)operator_new(0x78);
      TableFunctionRef::TableFunctionRef(this_00);
      pVVar5 = pVStack_88;
      local_118.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_118.
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_130._M_head_impl = this_00;
      if (local_90 != pVStack_88) {
        other = local_90;
        do {
          this_01 = (ConstantExpression *)operator_new(0x78);
          Value::Value(&local_f8,other);
          ConstantExpression::ConstantExpression(this_01,&local_f8);
          Value::~Value(&local_f8);
          local_120._M_head_impl = (ParsedExpression *)this_01;
          ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                      *)&local_118,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)&local_120);
          if ((ConstantExpression *)local_120._M_head_impl != (ConstantExpression *)0x0) {
            (*((BaseExpression *)
              &((local_120._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
              _vptr_BaseExpression[1])();
          }
          other = other + 1;
        } while (other != pVVar5);
      }
      make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((duckdb *)&local_f8,&local_b0,
                 (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  *)&local_118);
      uVar4 = local_f8.type_._0_8_;
      local_f8.type_._0_8_ = (ParsedExpression *)0x0;
      pTVar6 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_130);
      _Var2._M_head_impl =
           (pTVar6->function).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pTVar6->function).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
           (ParsedExpression *)uVar4;
      if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      }
      if ((ParsedExpression *)local_f8.type_._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)local_f8.type_._0_8_ + 8))();
      }
      _Var3._M_head_impl = local_130._M_head_impl;
      local_130._M_head_impl = (TableFunctionRef *)0x0;
      *(_func_int ***)
       local_128._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
           (_func_int **)_Var3._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&local_118);
      if (local_130._M_head_impl != (TableFunctionRef *)0x0) {
        (*((local_130._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
      }
    }
    if (local_78 != local_68) {
      operator_delete(local_78);
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
           (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
           local_128._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  }
  this_02 = (BinderException *)__cxa_allocate_exception(0x10);
  local_f8.type_._0_8_ =
       &local_f8.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"Error in replacement scan: %s\n","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_78 + local_70);
  BinderException::BinderException<std::__cxx11::string>(this_02,(string *)&local_f8,&local_58);
  __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<TableRef> duckdb_capi_replacement_callback(ClientContext &context, ReplacementScanInput &input,
                                                      optional_ptr<ReplacementScanData> data) {
	auto &table_name = input.table_name;
	auto &scan_data = data->Cast<CAPIReplacementScanData>();

	CAPIReplacementScanInfo info(&scan_data);
	scan_data.callback((duckdb_replacement_scan_info)&info, table_name.c_str(), scan_data.extra_data);
	if (!info.error.empty()) {
		throw BinderException("Error in replacement scan: %s\n", info.error);
	}
	if (info.function_name.empty()) {
		// no function provided: bail-out
		return nullptr;
	}
	auto table_function = make_uniq<TableFunctionRef>();
	vector<unique_ptr<ParsedExpression>> children;
	for (auto &param : info.parameters) {
		children.push_back(make_uniq<ConstantExpression>(std::move(param)));
	}
	table_function->function = make_uniq<FunctionExpression>(info.function_name, std::move(children));
	return std::move(table_function);
}